

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_VisibilityFromSame_Test::
~ValidationErrorTest_VisibilityFromSame_Test(ValidationErrorTest_VisibilityFromSame_Test *this)

{
  ValidationErrorTest_VisibilityFromSame_Test *this_local;
  
  ~ValidationErrorTest_VisibilityFromSame_Test(this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, VisibilityFromSame) {
  ParseAndBuildFile("vis.proto", R"schema(
        edition = "2024";
        package vis.test;

        local message LocalMessage {
        }
        export message ExportMessage {
          LocalMessage foo = 1;
        }
        )schema");
}